

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

bool checkParsed(QByteArrayView num,qsizetype used)

{
  qsizetype qVar1;
  storage_type *psVar2;
  long lVar3;
  
  psVar2 = num.m_data;
  lVar3 = num.m_size;
  if (0 < used) {
    qVar1 = used;
    if ((used < lVar3) && (psVar2[used] != '\0')) {
      while (qVar1 = used, (byte)psVar2[used] < 0x40) {
        if (((1L << (psVar2[used] & 0x3fU) & 0x100003e00U) == 0) ||
           (used = used + 1, qVar1 = lVar3, lVar3 == used)) break;
      }
    }
    if ((lVar3 <= qVar1) || (psVar2[qVar1] == '\0')) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool checkParsed(QByteArrayView num, qsizetype used)
{
    if (used <= 0)
        return false;

    const qsizetype len = num.size();
    if (used < len && num[used] != '\0') {
        while (used < len && ascii_isspace(num[used]))
            ++used;
    }

    if (used < len && num[used] != '\0')
        // we stopped at a non-digit character after converting some digits
        return false;

    return true;
}